

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereClauseInsert(WhereClause *pWC,Expr *p,u8 wtFlags)

{
  sqlite3 *db_00;
  undefined1 auVar1 [16];
  int iVar2;
  WhereTerm *pWVar3;
  WhereTerm *pWVar4;
  Expr *pEVar5;
  sqlite3 *db;
  WhereTerm *pOld;
  int idx;
  WhereTerm *pTerm;
  u8 wtFlags_local;
  Expr *p_local;
  WhereClause *pWC_local;
  
  if (pWC->nSlot <= pWC->nTerm) {
    pWVar4 = pWC->a;
    db_00 = pWC->pParse->db;
    pWVar3 = (WhereTerm *)sqlite3DbMallocRaw(db_00,pWC->nSlot * 0x70);
    pWC->a = pWVar3;
    if (pWC->a == (WhereTerm *)0x0) {
      if ((wtFlags & 1) != 0) {
        sqlite3ExprDelete(db_00,p);
      }
      pWC->a = pWVar4;
      return 0;
    }
    memcpy(pWC->a,pWVar4,(long)pWC->nTerm * 0x38);
    if (pWVar4 != pWC->aStatic) {
      sqlite3DbFree(db_00,pWVar4);
    }
    iVar2 = sqlite3DbMallocSize(db_00,pWC->a);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2;
    pWC->nSlot = SUB164(auVar1 / ZEXT816(0x38),0);
  }
  iVar2 = pWC->nTerm;
  pWC->nTerm = iVar2 + 1;
  pWVar4 = pWC->a + iVar2;
  pEVar5 = sqlite3ExprSkipCollate(p);
  pWVar4->pExpr = pEVar5;
  pWVar4->wtFlags = wtFlags;
  pWVar4->pWC = pWC;
  pWVar4->iParent = -1;
  return iVar2;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u8 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );  /* EV: R-00211-15100 */
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pParse->db;
    pWC->a = sqlite3DbMallocRaw(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  return idx;
}